

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O0

int coda_time_double_to_parts_utc
              (double datetime,int *year,int *month,int *day,int *hour,int *minute,int *second,
              int *musec)

{
  double *pdVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long *in_FS_OFFSET;
  double dVar5;
  int local_78;
  int is_leap_sec;
  int leap_sec;
  int dayseconds;
  int days;
  int us;
  int s;
  int min;
  int h;
  int y;
  int m;
  int d;
  double seconds;
  int *second_local;
  int *minute_local;
  int *hour_local;
  int *day_local;
  int *month_local;
  int *year_local;
  double datetime_local;
  
  seconds = (double)second;
  second_local = minute;
  minute_local = hour;
  hour_local = day;
  day_local = month;
  month_local = year;
  year_local = (int *)datetime;
  if (((((year == (int *)0x0) || (month == (int *)0x0)) || (day == (int *)0x0)) ||
      ((hour == (int *)0x0 || (minute == (int *)0x0)))) ||
     ((second == (int *)0x0 || (musec == (int *)0x0)))) {
    coda_set_error(-100,"date/time argument(s) are NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                   ,0x36a);
    datetime_local._4_4_ = -1;
  }
  else {
    iVar3 = coda_isNaN(datetime);
    if (iVar3 == 0) {
      iVar3 = coda_isInf((double)year_local);
      if (iVar3 == 0) {
        year_local = (int *)((double)year_local + 5e-07);
        _m = floor((double)year_local);
        if ((*(long *)(*in_FS_OFFSET + -0x108) == 0) || (*(int *)(*in_FS_OFFSET + -0x100) < 1)) {
          __assert_fail("leap_second_table != NULL && num_leap_seconds > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-time.c"
                        ,0x37e,
                        "int coda_time_double_to_parts_utc(double, int *, int *, int *, int *, int *, int *, int *)"
                       );
        }
        local_78 = 0;
        while( true ) {
          bVar2 = false;
          if (local_78 < *(int *)(*in_FS_OFFSET + -0x100)) {
            pdVar1 = (double *)(*(long *)(*in_FS_OFFSET + -0x108) + (long)local_78 * 8);
            bVar2 = *pdVar1 <= _m && _m != *pdVar1;
          }
          if (!bVar2) break;
          local_78 = local_78 + 1;
        }
        uVar4 = (uint)(ABS(_m - *(double *)(*(long *)(*in_FS_OFFSET + -0x108) + (long)local_78 * 8))
                      < 0.1);
        _m = _m - (double)(int)(local_78 + 10 + uVar4);
        year_local = (int *)((double)year_local - (double)(int)(local_78 + 10 + uVar4));
        dVar5 = floor(_m / 86400.0);
        iVar3 = mjd2000_to_dmy((int)dVar5,&y,&h,&min);
        if (iVar3 == 0) {
          iVar3 = seconds_to_hms((int)(-(double)(int)dVar5 * 86400.0 + _m),&s,&us,&days);
          if (iVar3 == 0) {
            dVar5 = floor(((double)year_local - _m) * 1000000.0);
            *month_local = min;
            *day_local = h;
            *hour_local = y;
            *minute_local = s;
            *second_local = us;
            *(uint *)seconds = days + uVar4;
            *musec = (int)dVar5;
            datetime_local._4_4_ = 0;
          }
          else {
            datetime_local._4_4_ = -1;
          }
        }
        else {
          datetime_local._4_4_ = -1;
        }
      }
      else {
        coda_set_error(-0x68,"datetime argument is Infinite");
        datetime_local._4_4_ = -1;
      }
    }
    else {
      coda_set_error(-0x68,"datetime argument is NaN");
      datetime_local._4_4_ = -1;
    }
  }
  return datetime_local._4_4_;
}

Assistant:

LIBCODA_API int coda_time_double_to_parts_utc(double datetime, int *year, int *month, int *day, int *hour, int *minute,
                                              int *second, int *musec)
{
    double seconds;
    int d, m, y;
    int h, min, s, us;
    int days, dayseconds;
    int leap_sec;
    int is_leap_sec;

    if (year == NULL || month == NULL || day == NULL || hour == NULL || minute == NULL || second == NULL ||
        musec == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "date/time argument(s) are NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (coda_isNaN(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is NaN");
        return -1;
    }
    if (coda_isInf(datetime))
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "datetime argument is Infinite");
        return -1;
    }

    /* we add 0.5 milliseconds so the floor() becomes a round() that rounds at the millisecond */
    datetime += 5E-7;

    seconds = floor(datetime);

    assert(leap_second_table != NULL && num_leap_seconds > 0);
    leap_sec = 0;
    while (leap_sec < num_leap_seconds && seconds > leap_second_table[leap_sec])
    {
        leap_sec++;
    }
    is_leap_sec = fabs(seconds - leap_second_table[leap_sec]) < 0.1;
    seconds -= 10 + leap_sec + is_leap_sec;
    datetime -= 10 + leap_sec + is_leap_sec;

    days = (int)floor(seconds / 86400.0);

    if (mjd2000_to_dmy(days, &d, &m, &y) != 0)
    {
        return -1;
    }

    dayseconds = (int)(seconds - days * 86400.0);

    if (seconds_to_hms(dayseconds, &h, &min, &s) != 0)
    {
        return -1;
    }

    us = (int)floor((datetime - seconds) * 1E6);

    *year = y;
    *month = m;
    *day = d;
    *hour = h;
    *minute = min;
    *second = s + is_leap_sec;
    *musec = us;

    return 0;
}